

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

bool __thiscall IPStatsRecord::WriteRecord(IPStatsRecord *this,FILE *F)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int local_38;
  int local_34;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  bool ret;
  FILE *F_local;
  IPStatsRecord *this_local;
  
  bVar2 = WriteIP(this,F);
  iVar4 = fprintf((FILE *)F,",%lu",this->query_volume);
  bVar2 = bVar2 && 0 < iVar4;
  bVar3 = bVar2;
  for (i_2 = 0; i_2 < 0x18; i_2 = i_2 + 1) {
    iVar4 = fprintf((FILE *)F,",%lu",this->hourly_volume[i_2]);
    bVar2 = (bool)(bVar2 & 0 < iVar4);
    bVar3 = (bool)(bVar3 & 0 < iVar4);
  }
  for (i_3 = 0; i_3 < 0x1f; i_3 = i_3 + 1) {
    iVar4 = fprintf((FILE *)F,",%lu",this->daily_volume[i_3]);
    bVar3 = (bool)(bVar2 & 0 < iVar4);
    bVar2 = bVar3;
  }
  iVar4 = fprintf((FILE *)F,",%lu",this->arpa_count);
  iVar5 = fprintf((FILE *)F,",%lu",this->no_such_domain_queries);
  iVar6 = fprintf((FILE *)F,",%lu",this->no_such_domain_reserved);
  iVar7 = fprintf((FILE *)F,",%lu",this->no_such_domain_frequent);
  iVar8 = fprintf((FILE *)F,",%lu",this->no_such_domain_chromioids);
  bVar1 = bVar3 & 0 < iVar4 & 0 < iVar5 & 0 < iVar6 & 0 < iVar7 & 0 < iVar8;
  for (i_4 = 0; i_4 < 8; i_4 = i_4 + 1) {
    iVar4 = fprintf((FILE *)F,",%lu",this->tld_counts[i_4]);
    bVar1 = bVar1 & 0 < iVar4;
  }
  iVar4 = fprintf((FILE *)F,",");
  bVar2 = HyperLogLog::WriteHyperLogLog(&this->tld_hyperlog,F);
  bVar2 = (bool)(bVar1 & 0 < iVar4 & bVar2);
  for (i_5 = 0; i_5 < 8; i_5 = i_5 + 1) {
    iVar4 = fprintf((FILE *)F,",%lu",this->sld_counts[i_5]);
    bVar2 = bVar2 != false && 0 < iVar4;
  }
  iVar4 = fprintf((FILE *)F,",");
  bVar3 = HyperLogLog::WriteHyperLogLog(&this->sld_hyperlog,F);
  bVar3 = (bVar2 != false && 0 < iVar4) && bVar3;
  for (i_6 = 0; i_6 < 8; i_6 = i_6 + 1) {
    iVar4 = fprintf((FILE *)F,",%lu",this->name_parts[i_6]);
    bVar3 = (bool)(bVar3 & 0 < iVar4);
  }
  for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
    iVar4 = fprintf((FILE *)F,",%lu",this->rr_types[local_34]);
    bVar3 = (bVar3 & 0 < iVar4) != 0;
  }
  for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
    iVar4 = fprintf((FILE *)F,",%lu",this->locales[local_38]);
    bVar3 = (bVar3 & 0 < iVar4) != 0;
  }
  iVar4 = fprintf((FILE *)F,"\n");
  return (bool)(bVar3 & 0 < iVar4);
}

Assistant:

bool IPStatsRecord::WriteRecord(FILE* F)
{
    bool ret = WriteIP(F);
    ret &= (fprintf(F, ",%" PRIu64, query_volume) > 0);
    for (int i = 0; i < 24; i++) {
        ret &= (fprintf(F, ",%" PRIu64, hourly_volume[i]) > 0);
    }
    for (int i = 0; i < 31; i++) {
        ret &= (fprintf(F, ",%" PRIu64, daily_volume[i]) > 0);
    }
    ret &= (fprintf(F, ",%" PRIu64, arpa_count) > 0);
    ret &= (fprintf(F, ",%" PRIu64, no_such_domain_queries) > 0);
    ret &= (fprintf(F, ",%" PRIu64, no_such_domain_reserved) > 0);
    ret &= (fprintf(F, ",%" PRIu64, no_such_domain_frequent) > 0);
    ret &= (fprintf(F, ",%" PRIu64, no_such_domain_chromioids) > 0);
    for (int i = 0; i < 8; i++) {
        ret &= (fprintf(F, ",%" PRIu64, tld_counts[i]) > 0);
    }
    ret &= (fprintf(F, ",") > 0);
    ret &= tld_hyperlog.WriteHyperLogLog(F);
    for (int i = 0; i < 8; i++) {
        ret &= (fprintf(F, ",%" PRIu64, sld_counts[i]) > 0);
    }
    ret &= (fprintf(F, ",") > 0);
    ret &= sld_hyperlog.WriteHyperLogLog(F);
    for (int i = 0; i < 8; i++) {
        ret &= (fprintf(F, ",%" PRIu64, name_parts[i]) > 0);
    }
    for (int i = 0; i < 8; i++) {
        ret &= (fprintf(F, ",%" PRIu64, rr_types[i]) > 0);
    }
    for (int i = 0; i < 8; i++) {
        ret &= (fprintf(F, ",%" PRIu64, locales[i]) > 0);
    }
    ret &= (fprintf(F, "\n") > 0);

    return ret;
}